

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.cpp
# Opt level: O3

void testReadScans(string *tempdir)

{
  undefined8 *puVar1;
  int iVar2;
  ostream *poVar3;
  void *pvVar4;
  size_t sVar5;
  undefined8 extraout_RAX;
  ostream *in_RCX;
  char *pcVar6;
  char *pcVar7;
  char *unaff_R12;
  ostream *unaff_R14;
  pointer __old_p;
  ostream *unaff_R15;
  exr_context_t f;
  int32_t ccount;
  exr_attr_box2i_t dw;
  uint64_t pchunksz;
  exr_chunk_info_t cinfo;
  string fn;
  exr_decode_pipeline_t decoder;
  undefined8 local_300;
  int local_2f4;
  undefined1 local_2f0 [4];
  int local_2ec;
  int local_2e4;
  long local_2e0;
  ostream local_2d8 [22];
  char local_2c2;
  char local_2c1;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  long *local_298 [2];
  long local_288 [2];
  undefined8 local_278;
  code *local_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 *local_210;
  short local_208;
  long local_1b0;
  long local_1a0;
  
  local_298[0] = local_288;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_298,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRCoreTest/../OpenEXRTest/"
             ,"");
  local_228 = 0;
  local_238 = 0;
  uStack_230 = 0;
  local_248 = 0;
  uStack_240 = 0;
  local_258 = 0;
  uStack_250 = 0;
  local_268 = 0;
  uStack_260 = 0;
  local_218 = 0;
  local_278 = 0x68;
  uStack_220 = 0xbf800000fffffffe;
  local_270 = err_cb;
  std::__cxx11::string::append((char *)local_298);
  iVar2 = exr_start_read(&local_300,local_298[0],&local_278);
  if (iVar2 == 0) {
    iVar2 = exr_get_chunk_count(0,0,&local_2f4);
    if (iVar2 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar2);
      if (pcVar6 != (char *)0x0) goto LAB_0013ee37;
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      goto LAB_0013ee4d;
    }
    iVar2 = exr_get_chunk_count(local_300,0xffffffff,&local_2f4);
    if (iVar2 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar2);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      }
      else {
        sVar5 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n    expected: (",0x10);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      unaff_R14 = (ostream *)exr_get_default_error_message(4);
      if (unaff_R14 != (ostream *)0x0) goto LAB_0013fc83;
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      goto LAB_0013fc99;
    }
    iVar2 = exr_get_chunk_count(local_300,0xb,&local_2f4);
    if (iVar2 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar2);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      }
      else {
        sVar5 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n    expected: (",0x10);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      unaff_R14 = (ostream *)exr_get_default_error_message(4);
      if (unaff_R14 != (ostream *)0x0) goto LAB_0013fcd8;
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      goto LAB_0013fcee;
    }
    iVar2 = exr_get_chunk_count(local_300,0,0);
    if (iVar2 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar2);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      }
      else {
        sVar5 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n    expected: (",0x10);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      unaff_R14 = (ostream *)exr_get_default_error_message(3);
      if (unaff_R14 != (ostream *)0x0) goto LAB_0013fd2d;
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      goto LAB_0013fd43;
    }
    iVar2 = exr_get_chunk_count(local_300,0,&local_2f4);
    if (iVar2 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar2);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      }
      else {
        sVar5 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar5);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      core_test_fail("exr_get_chunk_count (f, 0, &ccount)",(char *)0xef,0x1821a3,(char *)in_RCX);
LAB_0013f094:
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar5);
LAB_0013f0aa:
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n    expected: (",0x10);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      unaff_R14 = (ostream *)exr_get_default_error_message(2);
      if (unaff_R14 != (ostream *)0x0) goto LAB_0013fd82;
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      goto LAB_0013fd98;
    }
    iVar2 = exr_get_scanlines_per_chunk(0,0,&local_2f4);
    if (iVar2 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar2);
      if (pcVar6 != (char *)0x0) goto LAB_0013f094;
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      goto LAB_0013f0aa;
    }
    iVar2 = exr_get_scanlines_per_chunk(local_300,0xffffffff,&local_2f4);
    if (iVar2 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar2);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      }
      else {
        sVar5 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n    expected: (",0x10);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      unaff_R14 = (ostream *)exr_get_default_error_message(4);
      if (unaff_R14 != (ostream *)0x0) goto LAB_0013fdd7;
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      goto LAB_0013fded;
    }
    iVar2 = exr_get_scanlines_per_chunk(local_300,0xb,&local_2f4);
    if (iVar2 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar2);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      }
      else {
        sVar5 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n    expected: (",0x10);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      unaff_R14 = (ostream *)exr_get_default_error_message(4);
      if (unaff_R14 != (ostream *)0x0) goto LAB_0013fe2c;
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      goto LAB_0013fe42;
    }
    iVar2 = exr_get_scanlines_per_chunk(local_300,0,0);
    if (iVar2 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar2);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      }
      else {
        sVar5 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n    expected: (",0x10);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      unaff_R14 = (ostream *)exr_get_default_error_message(3);
      if (unaff_R14 != (ostream *)0x0) goto LAB_0013fe81;
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      goto LAB_0013fe97;
    }
    iVar2 = exr_get_scanlines_per_chunk(local_300,0,&local_2f4);
    if (iVar2 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar2);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      }
      else {
        sVar5 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar5);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      core_test_fail("exr_get_scanlines_per_chunk (f, 0, &ccount)",(char *)0xfc,0x1821a3,
                     (char *)in_RCX);
LAB_0013f2f1:
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar5);
LAB_0013f307:
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n    expected: (",0x10);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      unaff_R14 = (ostream *)exr_get_default_error_message(2);
      if (unaff_R14 != (ostream *)0x0) goto LAB_0013fed6;
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      goto LAB_0013feec;
    }
    if (local_2f4 != 1) {
      core_test_fail("ccount == 1",(char *)0xfd,0x1821a3,(char *)in_RCX);
      iVar2 = 0;
LAB_0013e2f4:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar2);
      if (pcVar6 != (char *)0x0) goto LAB_0013f2f1;
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      goto LAB_0013f307;
    }
    iVar2 = exr_get_data_window(0,0,local_2f0);
    if (iVar2 != 2) goto LAB_0013e2f4;
    iVar2 = exr_get_data_window(local_300,0xffffffff,local_2f0);
    if (iVar2 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar2);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      }
      else {
        sVar5 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n    expected: (",0x10);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      unaff_R14 = (ostream *)exr_get_default_error_message(4);
      if (unaff_R14 != (ostream *)0x0) goto LAB_0013ff2b;
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      goto LAB_0013ff41;
    }
    iVar2 = exr_get_data_window(local_300,1,local_2f0);
    if (iVar2 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar2);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      }
      else {
        sVar5 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n    expected: (",0x10);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      unaff_R14 = (ostream *)exr_get_default_error_message(4);
      if (unaff_R14 != (ostream *)0x0) goto LAB_0013ff80;
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      goto LAB_0013ff96;
    }
    iVar2 = exr_get_data_window(local_300,0,0);
    if (iVar2 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar2);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      }
      else {
        sVar5 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n    expected: (",0x10);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      unaff_R14 = (ostream *)exr_get_default_error_message(3);
      if (unaff_R14 != (ostream *)0x0) goto LAB_0013ffd5;
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      goto LAB_0013ffeb;
    }
    iVar2 = exr_get_data_window(local_300,0,local_2f0);
    if (iVar2 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar2);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      }
      else {
        sVar5 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar5);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      core_test_fail("exr_get_data_window (f, 0, &dw)",(char *)0x108,0x1821a3,(char *)in_RCX);
LAB_0013f54e:
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar5);
LAB_0013f564:
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n    expected: (",0x10);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      unaff_R14 = (ostream *)exr_get_default_error_message(2);
      if (unaff_R14 != (ostream *)0x0) goto LAB_0014002a;
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      goto LAB_00140040;
    }
    in_RCX = local_2d8;
    iVar2 = exr_read_scanline_chunk_info(0,0,0x2a);
    if (iVar2 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar2);
      if (pcVar6 != (char *)0x0) goto LAB_0013f54e;
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      goto LAB_0013f564;
    }
    in_RCX = local_2d8;
    iVar2 = exr_read_scanline_chunk_info(local_300,0xffffffff,0x2a);
    if (iVar2 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar2);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      }
      else {
        sVar5 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n    expected: (",0x10);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      unaff_R14 = (ostream *)exr_get_default_error_message(4);
      if (unaff_R14 != (ostream *)0x0) goto LAB_0014007f;
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      goto LAB_00140095;
    }
    poVar3 = local_2d8;
    in_RCX = poVar3;
    iVar2 = exr_read_scanline_chunk_info(local_300,1,0x2a);
    if (iVar2 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar2);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      }
      else {
        sVar5 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n    expected: (",0x10);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      unaff_R14 = (ostream *)exr_get_default_error_message(4);
      if (unaff_R14 != (ostream *)0x0) goto LAB_001400d4;
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      goto LAB_001400ea;
    }
    in_RCX = (ostream *)0x0;
    iVar2 = exr_read_scanline_chunk_info(local_300,0,0x2a);
    if (iVar2 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar2);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      }
      else {
        sVar5 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n    expected: (",0x10);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      unaff_R14 = (ostream *)exr_get_default_error_message(3);
      if (unaff_R14 != (ostream *)0x0) goto LAB_00140129;
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      goto LAB_0014013f;
    }
    in_RCX = (ostream *)0x2;
    iVar2 = exr_read_tile_chunk_info(local_300,0,4,2,0,0,poVar3);
    if (iVar2 != 0x13) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar2);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      }
      else {
        sVar5 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n    expected: (",0x10);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      unaff_R14 = (ostream *)exr_get_default_error_message(0x13);
      if (unaff_R14 != (ostream *)0x0) goto LAB_0014017e;
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      goto LAB_00140194;
    }
    in_RCX = local_2d8;
    iVar2 = exr_read_scanline_chunk_info(local_300,0,local_2ec + -1);
    if (iVar2 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar2);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      }
      else {
        sVar5 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n    expected: (",0x10);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
      unaff_R14 = (ostream *)exr_get_default_error_message(3);
      if (unaff_R14 != (ostream *)0x0) goto LAB_001401d3;
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      goto LAB_001401e9;
    }
    in_RCX = local_2d8;
    iVar2 = exr_read_scanline_chunk_info(local_300,0,local_2e4 + 1);
    if (iVar2 == 3) {
      in_RCX = local_2d8;
      iVar2 = exr_read_scanline_chunk_info(local_300,0,local_2ec);
      if (iVar2 == 0) {
        local_2e0 = 0;
        iVar2 = exr_get_chunk_unpacked_size(local_300,0);
        if (iVar2 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
          unaff_R14 = (ostream *)exr_get_default_error_message(iVar2);
          if (unaff_R14 != (ostream *)0x0) goto LAB_0013f931;
          std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
          goto LAB_0013f947;
        }
        if (local_2c2 != '\0') {
          pcVar6 = (char *)0x126;
          pcVar7 = "cinfo.type == EXR_STORAGE_SCANLINE";
LAB_0013e94a:
          core_test_fail(pcVar7,pcVar6,0x1821a3,(char *)in_RCX);
          iVar2 = 0;
LAB_0013e956:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
          unaff_R14 = (ostream *)exr_get_default_error_message(iVar2);
          if (unaff_R14 != (ostream *)0x0) goto LAB_0013f986;
          std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
          goto LAB_0013f99c;
        }
        if (local_2c1 != '\0') {
          pcVar6 = (char *)0x127;
          pcVar7 = "cinfo.compression == EXR_COMPRESSION_NONE";
          goto LAB_0013e94a;
        }
        if (local_2b8 != local_2e0) {
          pcVar6 = (char *)0x128;
          pcVar7 = "cinfo.packed_size == pchunksz";
          goto LAB_0013e94a;
        }
        if (local_2b0 != local_2b8) {
          pcVar6 = (char *)0x129;
          pcVar7 = "cinfo.unpacked_size == pchunksz";
          goto LAB_0013e94a;
        }
        if (local_2a8 != 0) {
          pcVar6 = (char *)0x12a;
          pcVar7 = "cinfo.sample_count_data_offset == 0";
          goto LAB_0013e94a;
        }
        if (local_2a0 != 0) {
          pcVar6 = (char *)0x12b;
          pcVar7 = "cinfo.sample_count_table_size == 0";
          goto LAB_0013e94a;
        }
        in_RCX = (ostream *)&local_210;
        iVar2 = exr_decoding_initialize(local_300,0,local_2d8);
        puVar1 = local_210;
        if (iVar2 != 0) goto LAB_0013e956;
        if (local_208 != 2) {
          pcVar6 = (char *)0x130;
          pcVar7 = "decoder.channel_count == 2";
LAB_0013ea81:
          core_test_fail(pcVar7,pcVar6,0x1821a3,(char *)in_RCX);
          iVar2 = 0;
LAB_0013ea8d:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          unaff_R15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
          std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,") ",2);
          unaff_R12 = (char *)exr_get_default_error_message(iVar2);
          if (unaff_R12 != (char *)0x0) goto LAB_0013f9db;
          std::ios::clear((int)unaff_R15 + (int)*(undefined8 *)(*(long *)unaff_R15 + -0x18));
          goto LAB_0013f9f1;
        }
        pcVar6 = (char *)0x131;
        pcVar7 = "!strcmp (decoder.channels[0].channel_name, \"R\")";
        if ((*(char *)*local_210 != 'R') || (((char *)*local_210)[1] != '\0')) goto LAB_0013ea81;
        if (*(char *)((long)local_210 + 0x19) != '\x02') {
          pcVar6 = (char *)0x132;
          pcVar7 = "decoder.channels[0].bytes_per_element == 2";
          goto LAB_0013ea81;
        }
        if (*(short *)((long)local_210 + 0x1a) != 1) {
          pcVar6 = (char *)0x133;
          pcVar7 = "decoder.channels[0].data_type == EXR_PIXEL_HALF";
          goto LAB_0013ea81;
        }
        if (*(int *)((long)local_210 + 0xc) != 0xb2) {
          pcVar6 = (char *)0x134;
          pcVar7 = "decoder.channels[0].width == 178";
          goto LAB_0013ea81;
        }
        if (*(int *)(local_210 + 1) != 1) {
          pcVar6 = (char *)0x135;
          pcVar7 = "decoder.channels[0].height == 1";
          goto LAB_0013ea81;
        }
        if (*(int *)(local_210 + 2) != 1) {
          pcVar6 = (char *)0x136;
          pcVar7 = "decoder.channels[0].x_samples == 1";
          goto LAB_0013ea81;
        }
        if (*(int *)((long)local_210 + 0x14) != 1) {
          pcVar6 = (char *)0x137;
          pcVar7 = "decoder.channels[0].y_samples == 1";
          goto LAB_0013ea81;
        }
        pcVar6 = (char *)0x138;
        pcVar7 = "!strcmp (decoder.channels[1].channel_name, \"Z\")";
        if ((*(char *)local_210[6] != 'Z') || (((char *)local_210[6])[1] != '\0'))
        goto LAB_0013ea81;
        if (*(char *)((long)local_210 + 0x49) != '\x04') {
          pcVar6 = (char *)0x139;
          pcVar7 = "decoder.channels[1].bytes_per_element == 4";
          goto LAB_0013ea81;
        }
        if (*(short *)((long)local_210 + 0x4a) != 2) {
          pcVar6 = (char *)0x13a;
          pcVar7 = "decoder.channels[1].data_type == EXR_PIXEL_FLOAT";
          goto LAB_0013ea81;
        }
        if (*(int *)((long)local_210 + 0x3c) != 0xb2) {
          pcVar6 = (char *)0x13b;
          pcVar7 = "decoder.channels[1].width == 178";
          goto LAB_0013ea81;
        }
        if (*(int *)(local_210 + 7) != 1) {
          pcVar6 = (char *)0x13c;
          pcVar7 = "decoder.channels[1].height == 1";
          goto LAB_0013ea81;
        }
        if (*(int *)(local_210 + 8) != 1) {
          pcVar6 = (char *)0x13d;
          pcVar7 = "decoder.channels[1].x_samples == 1";
          goto LAB_0013ea81;
        }
        if (*(int *)((long)local_210 + 0x44) != 1) {
          pcVar6 = (char *)0x13e;
          pcVar7 = "decoder.channels[1].y_samples == 1";
          goto LAB_0013ea81;
        }
        unaff_R14 = (ostream *)operator_new__(0x164);
        poVar3 = (ostream *)operator_new__(0x2c8);
        memset(unaff_R14,0xff,0x164);
        memset(poVar3,0xff,0x2c8);
        puVar1[5] = unaff_R14;
        puVar1[4] = 0x16400000002;
        puVar1[0xb] = poVar3;
        puVar1[10] = 0x2c800000004;
        iVar2 = exr_decoding_choose_default_routines(local_300,0,&local_210);
        if (iVar2 != 0) goto LAB_0013ea8d;
        iVar2 = exr_decoding_run(local_300,0,&local_210);
        if (iVar2 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          unaff_R15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
          std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,") ",2);
          unaff_R12 = (char *)exr_get_default_error_message(iVar2);
          if (unaff_R12 != (char *)0x0) goto LAB_0013fa30;
          std::ios::clear((int)unaff_R15 + (int)*(undefined8 *)(*(long *)unaff_R15 + -0x18));
          goto LAB_0013fa46;
        }
        if (local_1b0 != 0) {
          pcVar6 = (char *)0x150;
          pcVar7 = "decoder.packed_buffer == __null";
LAB_0013eb85:
          core_test_fail(pcVar7,pcVar6,0x1821a3,(char *)in_RCX);
LAB_0013eb91:
          pcVar6 = (char *)0x156;
          pcVar7 = "*curr == 0";
LAB_0013ebab:
          core_test_fail(pcVar7,pcVar6,0x1821a3,(char *)in_RCX);
          iVar2 = 0;
LAB_0013ebb7:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          unaff_R15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
          std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,") ",2);
          unaff_R12 = (char *)exr_get_default_error_message(iVar2);
          if (unaff_R12 != (char *)0x0) goto LAB_0013fa85;
          std::ios::clear((int)unaff_R15 + (int)*(undefined8 *)(*(long *)unaff_R15 + -0x18));
          goto LAB_0013fa9b;
        }
        if (local_1a0 != 0) {
          pcVar6 = (char *)0x152;
          pcVar7 = "decoder.unpacked_buffer == __null";
          goto LAB_0013eb85;
        }
        if (*(short *)unaff_R14 != 0) goto LAB_0013eb91;
        if (1e-06 <= ABS(*(float *)poVar3 + -0.101991)) {
          pcVar6 = (char *)0x157;
          pcVar7 = "fabsf (*curz - 0.101991f) < 0.000001f";
          goto LAB_0013ebab;
        }
        iVar2 = exr_decoding_destroy(local_300,&local_210);
        if (iVar2 != 0) goto LAB_0013ebb7;
        in_RCX = (ostream *)&local_210;
        iVar2 = exr_decoding_initialize(local_300,0,local_2d8);
        if (iVar2 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          unaff_R15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
          std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,") ",2);
          unaff_R12 = (char *)exr_get_default_error_message(iVar2);
          if (unaff_R12 != (char *)0x0) goto LAB_0013fada;
          std::ios::clear((int)unaff_R15 + (int)*(undefined8 *)(*(long *)unaff_R15 + -0x18));
          goto LAB_0013faf0;
        }
        pvVar4 = operator_new__(0x2c8);
        operator_delete__(unaff_R14);
        local_210[5] = pvVar4;
        *(undefined4 *)((long)local_210 + 0x24) = 0x2c8;
        in_RCX = (ostream *)0x400020004;
        *(undefined8 *)((long)local_210 + 0x1c) = 0x400020004;
        local_210[0xb] = poVar3;
        local_210[10] = 0x2c800000004;
        iVar2 = exr_decoding_choose_default_routines(local_300,0);
        if (iVar2 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          unaff_R14 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
          std::__ostream_insert<char,std::char_traits<char>>(unaff_R14,") ",2);
          unaff_R12 = (char *)exr_get_default_error_message(iVar2);
          if (unaff_R12 != (char *)0x0) goto LAB_0013fb2f;
          std::ios::clear((int)unaff_R14 + (int)*(undefined8 *)(*(long *)unaff_R14 + -0x18));
          goto LAB_0013fb45;
        }
        iVar2 = exr_decoding_run(local_300,0,&local_210);
        if (iVar2 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          unaff_R14 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
          std::__ostream_insert<char,std::char_traits<char>>(unaff_R14,") ",2);
          unaff_R12 = (char *)exr_get_default_error_message(iVar2);
          if (unaff_R12 != (char *)0x0) goto LAB_0013fb84;
          std::ios::clear((int)unaff_R14 + (int)*(undefined8 *)(*(long *)unaff_R14 + -0x18));
          goto LAB_0013fb9a;
        }
        iVar2 = exr_decoding_destroy(local_300,&local_210);
        if (iVar2 == 0) {
          exr_finish(&local_300);
          operator_delete__(poVar3);
          operator_delete__(pvVar4);
          if (local_298[0] != local_288) {
            operator_delete(local_298[0],local_288[0] + 1);
          }
          return;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Return Error: (",0xf);
        unaff_R14 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
        std::__ostream_insert<char,std::char_traits<char>>(unaff_R14,") ",2);
        unaff_R12 = (char *)exr_get_default_error_message(iVar2);
        if (unaff_R12 != (char *)0x0) goto LAB_0013fbd9;
        std::ios::clear((int)unaff_R14 + (int)*(undefined8 *)(*(long *)unaff_R14 + -0x18));
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Return Error: (",0xf);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
        unaff_R14 = (ostream *)exr_get_default_error_message(iVar2);
        if (unaff_R14 == (ostream *)0x0) {
          std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
        }
        else {
          sVar5 = strlen((char *)unaff_R14);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)unaff_R14,sVar5);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        core_test_fail("exr_read_scanline_chunk_info (f, 0, dw.min.y, &cinfo)",(char *)0x122,
                       0x1821a3,(char *)in_RCX);
LAB_0013f931:
        sVar5 = strlen((char *)unaff_R14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)unaff_R14,sVar5);
LAB_0013f947:
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        core_test_fail("exr_get_chunk_unpacked_size (f, 0, &pchunksz)",(char *)0x125,0x1821a3,
                       (char *)in_RCX);
LAB_0013f986:
        sVar5 = strlen((char *)unaff_R14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)unaff_R14,sVar5);
LAB_0013f99c:
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        core_test_fail("exr_decoding_initialize (f, 0, &cinfo, &decoder)",(char *)0x12e,0x1821a3,
                       (char *)in_RCX);
LAB_0013f9db:
        sVar5 = strlen(unaff_R12);
        std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,unaff_R12,sVar5);
LAB_0013f9f1:
        std::ios::widen((char)*(undefined8 *)(*(long *)unaff_R15 + -0x18) + (char)unaff_R15);
        std::ostream::put((char)unaff_R15);
        std::ostream::flush();
        core_test_fail("exr_decoding_choose_default_routines (f, 0, &decoder)",(char *)0x14b,
                       0x1821a3,(char *)in_RCX);
LAB_0013fa30:
        sVar5 = strlen(unaff_R12);
        std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,unaff_R12,sVar5);
LAB_0013fa46:
        std::ios::widen((char)*(undefined8 *)(*(long *)unaff_R15 + -0x18) + (char)unaff_R15);
        std::ostream::put((char)unaff_R15);
        std::ostream::flush();
        core_test_fail("exr_decoding_run (f, 0, &decoder)",(char *)0x14d,0x1821a3,(char *)in_RCX);
LAB_0013fa85:
        sVar5 = strlen(unaff_R12);
        std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,unaff_R12,sVar5);
LAB_0013fa9b:
        std::ios::widen((char)*(undefined8 *)(*(long *)unaff_R15 + -0x18) + (char)unaff_R15);
        std::ostream::put((char)unaff_R15);
        std::ostream::flush();
        core_test_fail("exr_decoding_destroy (f, &decoder)",(char *)0x159,0x1821a3,(char *)in_RCX);
LAB_0013fada:
        sVar5 = strlen(unaff_R12);
        std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,unaff_R12,sVar5);
LAB_0013faf0:
        std::ios::widen((char)*(undefined8 *)(*(long *)unaff_R15 + -0x18) + (char)unaff_R15);
        std::ostream::put((char)unaff_R15);
        std::ostream::flush();
        core_test_fail("exr_decoding_initialize (f, 0, &cinfo, &decoder)",(char *)0x15b,0x1821a3,
                       (char *)in_RCX);
LAB_0013fb2f:
        sVar5 = strlen(unaff_R12);
        std::__ostream_insert<char,std::char_traits<char>>(unaff_R14,unaff_R12,sVar5);
LAB_0013fb45:
        std::ios::widen((char)*(undefined8 *)(*(long *)unaff_R14 + -0x18) + (char)unaff_R14);
        std::ostream::put((char)unaff_R14);
        std::ostream::flush();
        core_test_fail("exr_decoding_choose_default_routines (f, 0, &decoder)",(char *)0x166,
                       0x1821a3,(char *)in_RCX);
LAB_0013fb84:
        sVar5 = strlen(unaff_R12);
        std::__ostream_insert<char,std::char_traits<char>>(unaff_R14,unaff_R12,sVar5);
LAB_0013fb9a:
        std::ios::widen((char)*(undefined8 *)(*(long *)unaff_R14 + -0x18) + (char)unaff_R14);
        std::ostream::put((char)unaff_R14);
        std::ostream::flush();
        core_test_fail("exr_decoding_run (f, 0, &decoder)",(char *)0x168,0x1821a3,(char *)in_RCX);
LAB_0013fbd9:
        sVar5 = strlen(unaff_R12);
        std::__ostream_insert<char,std::char_traits<char>>(unaff_R14,unaff_R12,sVar5);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)unaff_R14 + -0x18) + (char)unaff_R14);
      std::ostream::put((char)unaff_R14);
      std::ostream::flush();
      core_test_fail("exr_decoding_destroy (f, &decoder)",(char *)0x16a,0x1821a3,(char *)in_RCX);
      goto LAB_0013fc2e;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(iVar2);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n    expected: (",0x10);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
    unaff_R14 = (ostream *)exr_get_default_error_message(3);
    if (unaff_R14 == (ostream *)0x0) {
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
      goto LAB_0014023e;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(iVar2);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    core_test_fail("exr_start_read (&f, fn.c_str (), &cinit)",(char *)0xe4,0x1821a3,(char *)in_RCX);
LAB_0013ee37:
    sVar5 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar5);
LAB_0013ee4d:
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n    expected: (",0x10);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
    unaff_R14 = (ostream *)exr_get_default_error_message(2);
    if (unaff_R14 == (ostream *)0x0) {
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
LAB_0013fc2e:
      sVar5 = strlen((char *)unaff_R14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)unaff_R14,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    core_test_fail("exr_get_chunk_count (__null, 0, &ccount)",(char *)0xe8,0x1821a3,(char *)in_RCX);
LAB_0013fc83:
    sVar5 = strlen((char *)unaff_R14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)unaff_R14,sVar5);
LAB_0013fc99:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    core_test_fail("exr_get_chunk_count (f, -1, &ccount)",(char *)0xea,0x1821a3,(char *)in_RCX);
LAB_0013fcd8:
    sVar5 = strlen((char *)unaff_R14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)unaff_R14,sVar5);
LAB_0013fcee:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    core_test_fail("exr_get_chunk_count (f, 11, &ccount)",(char *)0xec,0x1821a3,(char *)in_RCX);
LAB_0013fd2d:
    sVar5 = strlen((char *)unaff_R14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)unaff_R14,sVar5);
LAB_0013fd43:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    core_test_fail("exr_get_chunk_count (f, 0, __null)",(char *)0xee,0x1821a3,(char *)in_RCX);
LAB_0013fd82:
    sVar5 = strlen((char *)unaff_R14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)unaff_R14,sVar5);
LAB_0013fd98:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    core_test_fail("exr_get_scanlines_per_chunk (__null, 0, &ccount)",(char *)0xf3,0x1821a3,
                   (char *)in_RCX);
LAB_0013fdd7:
    sVar5 = strlen((char *)unaff_R14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)unaff_R14,sVar5);
LAB_0013fded:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    core_test_fail("exr_get_scanlines_per_chunk (f, -1, &ccount)",(char *)0xf6,0x1821a3,
                   (char *)in_RCX);
LAB_0013fe2c:
    sVar5 = strlen((char *)unaff_R14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)unaff_R14,sVar5);
LAB_0013fe42:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    core_test_fail("exr_get_scanlines_per_chunk (f, 11, &ccount)",(char *)0xf9,0x1821a3,
                   (char *)in_RCX);
LAB_0013fe81:
    sVar5 = strlen((char *)unaff_R14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)unaff_R14,sVar5);
LAB_0013fe97:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    core_test_fail("exr_get_scanlines_per_chunk (f, 0, __null)",(char *)0xfb,0x1821a3,(char *)in_RCX
                  );
LAB_0013fed6:
    sVar5 = strlen((char *)unaff_R14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)unaff_R14,sVar5);
LAB_0013feec:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    core_test_fail("exr_get_data_window (__null, 0, &dw)",(char *)0x101,0x1821a3,(char *)in_RCX);
LAB_0013ff2b:
    sVar5 = strlen((char *)unaff_R14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)unaff_R14,sVar5);
LAB_0013ff41:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    core_test_fail("exr_get_data_window (f, -1, &dw)",(char *)0x103,0x1821a3,(char *)in_RCX);
LAB_0013ff80:
    sVar5 = strlen((char *)unaff_R14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)unaff_R14,sVar5);
LAB_0013ff96:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    core_test_fail("exr_get_data_window (f, 1, &dw)",(char *)0x105,0x1821a3,(char *)in_RCX);
LAB_0013ffd5:
    sVar5 = strlen((char *)unaff_R14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)unaff_R14,sVar5);
LAB_0013ffeb:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    core_test_fail("exr_get_data_window (f, 0, __null)",(char *)0x107,0x1821a3,(char *)in_RCX);
LAB_0014002a:
    sVar5 = strlen((char *)unaff_R14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)unaff_R14,sVar5);
LAB_00140040:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    core_test_fail("exr_read_scanline_chunk_info (__null, 0, 42, &cinfo)",(char *)0x10d,0x1821a3,
                   (char *)in_RCX);
LAB_0014007f:
    sVar5 = strlen((char *)unaff_R14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)unaff_R14,sVar5);
LAB_00140095:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    core_test_fail("exr_read_scanline_chunk_info (f, -1, 42, &cinfo)",(char *)0x110,0x1821a3,
                   (char *)in_RCX);
LAB_001400d4:
    sVar5 = strlen((char *)unaff_R14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)unaff_R14,sVar5);
LAB_001400ea:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    core_test_fail("exr_read_scanline_chunk_info (f, 1, 42, &cinfo)",(char *)0x113,0x1821a3,
                   (char *)in_RCX);
LAB_00140129:
    sVar5 = strlen((char *)unaff_R14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)unaff_R14,sVar5);
LAB_0014013f:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    core_test_fail("exr_read_scanline_chunk_info (f, 0, 42, __null)",(char *)0x116,0x1821a3,
                   (char *)in_RCX);
LAB_0014017e:
    sVar5 = strlen((char *)unaff_R14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)unaff_R14,sVar5);
LAB_00140194:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    core_test_fail("exr_read_tile_chunk_info (f, 0, 4, 2, 0, 0, &cinfo)",(char *)0x11a,0x1821a3,
                   (char *)in_RCX);
LAB_001401d3:
    sVar5 = strlen((char *)unaff_R14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)unaff_R14,sVar5);
LAB_001401e9:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    core_test_fail("exr_read_scanline_chunk_info (f, 0, dw.min.y - 1, &cinfo)",(char *)0x11e,
                   0x1821a3,(char *)in_RCX);
  }
  sVar5 = strlen((char *)unaff_R14);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)unaff_R14,sVar5);
LAB_0014023e:
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  core_test_fail("exr_read_scanline_chunk_info (f, 0, dw.max.y + 1, &cinfo)",(char *)0x121,0x1821a3,
                 (char *)in_RCX);
  operator_delete__(unaff_R14);
  if (local_298[0] != local_288) {
    operator_delete(local_298[0],local_288[0] + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
testOpenTiles (const std::string& tempdir)
{
    exr_context_t             f;
    std::string               fn    = ILM_IMF_TEST_IMAGEDIR;
    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    cinit.error_handler_fn          = &err_cb;

    fn += "tiled.exr";
    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
    exr_finish (&f);

    fn = ILM_IMF_TEST_IMAGEDIR;
    fn += "v1.7.test.tiled.exr";
    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
    exr_finish (&f);
}